

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O3

void zzSubMod(word *c,word *a,word *b,word *mod,size_t n)

{
  word wVar1;
  
  wVar1 = zzSub(c,a,b,n);
  zzAddAndW(c,mod,n,-wVar1);
  return;
}

Assistant:

void SAFE(zzSubMod)(word c[], const word a[], const word b[], const word mod[],
	size_t n)
{
	register word mask = 0;
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	ASSERT(wwIsDisjoint(c, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmp(b, mod, n) < 0);
	// mask <- a < b ? WORD_MAX : WORD_0
	mask = WORD_0 - zzSub(c, a, b, n);
	zzAddAndW(c, mod,  n, mask);
	mask = 0;
}